

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

ssize_t fio_read(intptr_t uuid,void *buffer,size_t count)

{
  char *pcVar1;
  undefined1 *puVar2;
  char cVar3;
  undefined1 uVar4;
  char cVar5;
  int iVar6;
  code *pcVar7;
  fio_data_s *pfVar8;
  int *piVar9;
  long lVar10;
  uint uVar11;
  fio_lock_i ret;
  timespec local_58;
  int local_44;
  long local_40;
  undefined8 local_38;
  
  pfVar8 = fio_data;
  if ((-1 < uuid) && (uVar11 = (uint)((ulong)uuid >> 8), uVar11 < fio_data->capa)) {
    lVar10 = (long)(int)uVar11 * 0xa8;
    cVar5 = *(char *)((long)fio_data + lVar10 + 0x6d);
    if ((cVar5 == (char)uuid) && (*(char *)((long)fio_data + lVar10 + 0x6f) != '\0')) {
      if (count == 0) {
        return 0;
      }
      LOCK();
      pcVar1 = (char *)((long)fio_data + lVar10 + 0x6e);
      cVar3 = *pcVar1;
      *pcVar1 = '\x01';
      UNLOCK();
      local_40 = lVar10;
      if (cVar3 != '\0') {
        do {
          local_58.tv_sec = 0;
          local_58.tv_nsec = 1;
          nanosleep(&local_58,(timespec *)0x0);
          LOCK();
          pcVar1 = (char *)((long)pfVar8 + lVar10 + 0x6e);
          cVar3 = *pcVar1;
          *pcVar1 = '\x01';
          UNLOCK();
        } while (cVar3 != '\0');
      }
      local_38 = *(undefined8 *)((long)&fio_data[2].workers + local_40);
      pcVar7 = (code *)**(undefined8 **)((long)&fio_data[2].thread_ids.obj + local_40);
      LOCK();
      puVar2 = (undefined1 *)((long)&fio_data[1].thread_ids.obj + local_40 + 6);
      uVar4 = *puVar2;
      *puVar2 = 0;
      UNLOCK();
      local_58.tv_sec = CONCAT71(local_58.tv_sec._1_7_,uVar4);
      piVar9 = __errno_location();
      local_44 = *piVar9;
      do {
        lVar10 = (*pcVar7)(uuid,local_38,buffer,count);
        if (0 < lVar10) {
          if (fio_data->capa <= uVar11) {
            return lVar10;
          }
          if (*(char *)((long)&fio_data[1].thread_ids.obj + local_40 + 5) == cVar5) {
            *(__time_t *)((long)&fio_data[1].thread_ids.next + local_40) =
                 (fio_data->last_cycle).tv_sec;
            return lVar10;
          }
          return lVar10;
        }
        if (-1 < lVar10) goto LAB_0012ce31;
        iVar6 = *piVar9;
      } while (iVar6 == 4);
      if ((iVar6 == 0x6b) || (iVar6 == 0xb)) {
        *piVar9 = local_44;
        return 0;
      }
LAB_0012ce31:
      fio_force_close(uuid);
      return -1;
    }
  }
  piVar9 = __errno_location();
  *piVar9 = 9;
  return -1;
}

Assistant:

ssize_t fio_read(intptr_t uuid, void *buffer, size_t count) {
  if (!uuid_is_valid(uuid) || !uuid_data(uuid).open) {
    errno = EBADF;
    return -1;
  }
  if (count == 0)
    return 0;
  fio_lock(&uuid_data(uuid).sock_lock);
  ssize_t (*rw_read)(intptr_t, void *, void *, size_t) =
      uuid_data(uuid).rw_hooks->read;
  void *udata = uuid_data(uuid).rw_udata;
  fio_unlock(&uuid_data(uuid).sock_lock);
  int old_errno = errno;
  ssize_t ret;
retry_int:
  ret = rw_read(uuid, udata, buffer, count);
  if (ret > 0) {
    fio_touch(uuid);
    return ret;
  }
  if (ret < 0 && errno == EINTR)
    goto retry_int;
  if (ret < 0 &&
      (errno == EWOULDBLOCK || errno == EAGAIN || errno == ENOTCONN)) {
    errno = old_errno;
    return 0;
  }
  fio_force_close(uuid);
  return -1;
}